

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest.hpp
# Opt level: O0

void __thiscall iutest::UnitTestSource::Initialize(UnitTestSource *this)

{
  UnitTest *this_00;
  UnitTestSource *this_local;
  
  this_00 = UnitTest::instance();
  UnitTest::Initialize(this_00);
  return;
}

Assistant:

void Initialize()
    {
        UnitTest::instance().Initialize();
    }